

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O2

void __thiscall HighsSymmetryDetection::removeFixPoints(HighsSymmetryDetection *this)

{
  uint uVar1;
  int iVar2;
  pointer ppVar3;
  pointer piVar4;
  pointer piVar5;
  pointer piVar6;
  pointer piVar7;
  int *piVar8;
  int *piVar9;
  bool bVar10;
  HighsInt HVar11;
  int *piVar12;
  int iVar13;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var14;
  const_iterator __first;
  ulong uVar15;
  ulong uVar16;
  pointer ppVar17;
  pointer ppVar18;
  pointer ppVar19;
  ulong uVar20;
  HighsInt j;
  pointer ppVar21;
  long lVar22;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __it;
  int __tmp;
  int iVar23;
  long lVar24;
  HighsInt i;
  HighsInt unitCellIndex;
  HighsSymmetryDetection *local_58;
  int *local_50;
  int local_44;
  HighsSymmetryDetection *local_40;
  int *local_38;
  
  std::vector<int,_std::allocator<int>_>::resize(&this->Gend,(long)this->numVertices);
  ppVar3 = (this->Gedge).
           super__Vector_base<std::pair<int,_unsigned_int>,_std::allocator<std::pair<int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar4 = (this->Gstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar5 = (this->Gend).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar22 = 0;
LAB_002f4376:
  local_44 = this->numVertices;
  if (lVar22 < local_44) {
    ppVar21 = ppVar3 + piVar4[lVar22];
    ppVar17 = ppVar3 + piVar4[lVar22 + 1];
    do {
      piVar6 = (this->currentPartitionLinks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar7 = (this->vertexToCell).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      while( true ) {
        ppVar19 = ppVar17;
        if (ppVar21 == ppVar17) goto LAB_002f4402;
        iVar13 = ppVar21->first;
        iVar23 = piVar7[iVar13];
        if (piVar6[iVar23] - iVar23 < 2) break;
        ppVar21 = ppVar21 + 1;
      }
      do {
        ppVar18 = ppVar17;
        ppVar17 = ppVar18 + -1;
        ppVar19 = ppVar21;
        if (ppVar17 == ppVar21) goto LAB_002f4402;
        iVar23 = piVar7[ppVar17->first];
      } while (piVar6[iVar23] - iVar23 < 2);
      ppVar21->first = ppVar17->first;
      ppVar17->first = iVar13;
      uVar1 = ppVar21->second;
      ppVar21->second = ppVar18[-1].second;
      ppVar18[-1].second = uVar1;
      ppVar21 = ppVar21 + 1;
    } while( true );
  }
  local_50 = &local_44;
  __it._M_current =
       (this->currentPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  piVar8 = (this->currentPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar24 = (long)piVar8 - (long)__it._M_current;
  local_58 = this;
  local_40 = this;
  local_38 = local_50;
  for (lVar22 = lVar24 >> 4; _Var14._M_current = __it._M_current, 0 < lVar22; lVar22 = lVar22 + -1)
  {
    bVar10 = __gnu_cxx::__ops::_Iter_pred<HighsSymmetryDetection::removeFixPoints()::$_1>::
             operator()((_Iter_pred<HighsSymmetryDetection::removeFixPoints()::__1> *)&local_58,__it
                       );
    if (bVar10) goto LAB_002f4502;
    bVar10 = __gnu_cxx::__ops::_Iter_pred<HighsSymmetryDetection::removeFixPoints()::$_1>::
             operator()((_Iter_pred<HighsSymmetryDetection::removeFixPoints()::__1> *)&local_58,
                        (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                        (__it._M_current + 1));
    _Var14._M_current = __it._M_current + 1;
    if (bVar10) goto LAB_002f4502;
    bVar10 = __gnu_cxx::__ops::_Iter_pred<HighsSymmetryDetection::removeFixPoints()::$_1>::
             operator()((_Iter_pred<HighsSymmetryDetection::removeFixPoints()::__1> *)&local_58,
                        (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                        (__it._M_current + 2));
    _Var14._M_current = __it._M_current + 2;
    if (bVar10) goto LAB_002f4502;
    bVar10 = __gnu_cxx::__ops::_Iter_pred<HighsSymmetryDetection::removeFixPoints()::$_1>::
             operator()((_Iter_pred<HighsSymmetryDetection::removeFixPoints()::__1> *)&local_58,
                        (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                        (__it._M_current + 3));
    _Var14._M_current = __it._M_current + 3;
    if (bVar10) goto LAB_002f4502;
    __it._M_current = __it._M_current + 4;
    lVar24 = lVar24 + -0x10;
  }
  lVar24 = lVar24 >> 2;
  if (lVar24 != 1) {
    if (lVar24 != 2) {
      __first._M_current = piVar8;
      if (lVar24 != 3) goto LAB_002f4547;
      bVar10 = __gnu_cxx::__ops::_Iter_pred<HighsSymmetryDetection::removeFixPoints()::$_1>::
               operator()((_Iter_pred<HighsSymmetryDetection::removeFixPoints()::__1> *)&local_58,
                          __it);
      if (bVar10) goto LAB_002f4502;
      __it._M_current = __it._M_current + 1;
    }
    bVar10 = __gnu_cxx::__ops::_Iter_pred<HighsSymmetryDetection::removeFixPoints()::$_1>::
             operator()((_Iter_pred<HighsSymmetryDetection::removeFixPoints()::__1> *)&local_58,__it
                       );
    _Var14._M_current = __it._M_current;
    if (bVar10) goto LAB_002f4502;
    __it._M_current = __it._M_current + 1;
  }
  bVar10 = __gnu_cxx::__ops::_Iter_pred<HighsSymmetryDetection::removeFixPoints()::$_1>::operator()
                     ((_Iter_pred<HighsSymmetryDetection::removeFixPoints()::__1> *)&local_58,__it);
  _Var14._M_current = __it._M_current;
  if (!bVar10) {
    _Var14._M_current = piVar8;
  }
LAB_002f4502:
  __first._M_current = _Var14._M_current;
  if (_Var14._M_current != piVar8) {
    while (_Var14._M_current = _Var14._M_current + 1, _Var14._M_current != piVar8) {
      bVar10 = __gnu_cxx::__ops::_Iter_pred<HighsSymmetryDetection::removeFixPoints()::$_1>::
               operator()((_Iter_pred<HighsSymmetryDetection::removeFixPoints()::__1> *)&local_40,
                          _Var14);
      if (!bVar10) {
        *__first._M_current = *_Var14._M_current;
        __first._M_current = __first._M_current + 1;
      }
    }
  }
LAB_002f4547:
  std::vector<int,_std::allocator<int>_>::erase
            (&this->currentPartition,__first,
             (const_iterator)
             (this->currentPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish);
  uVar1 = this->numVertices;
  piVar4 = (this->Gstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar5 = (this->Gend).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar15 = 0;
  uVar20 = 0;
  if (0 < (int)uVar1) {
    uVar15 = (ulong)uVar1;
  }
  while (uVar16 = uVar20, uVar16 != uVar15) {
    iVar13 = piVar5[uVar16];
    lVar22 = (long)iVar13;
    iVar23 = piVar4[uVar16 + 1];
    uVar20 = uVar16 + 1;
    if (iVar13 != iVar23) {
      ppVar3 = (this->Gedge).
               super__Vector_base<std::pair<int,_unsigned_int>,_std::allocator<std::pair<int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar6 = (this->vertexToCell).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (; lVar22 < iVar23; lVar22 = lVar22 + 1) {
        ppVar3[lVar22].first = piVar6[ppVar3[lVar22].first];
        iVar23 = piVar4[uVar16 + 1];
      }
    }
  }
  iVar13 = (int)((ulong)((long)(this->currentPartition).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(this->currentPartition).super__Vector_base<int,_std::allocator<int>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 2);
  if (iVar13 < (int)uVar1) {
    this->numVertices = iVar13;
    if (iVar13 == 0) {
      HVar11 = 0;
    }
    else {
      std::vector<int,_std::allocator<int>_>::resize(&this->currentPartitionLinks,(long)iVar13);
      local_58 = (HighsSymmetryDetection *)((ulong)local_58 & 0xffffffffffffff00);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_assign
                (&this->cellInRefinementQueue,(long)this->numVertices,
                 (value_type_conflict5 *)&local_58);
      piVar4 = (this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish != piVar4) {
        (this->refinementQueue).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = piVar4;
      }
      lVar22 = 0;
      iVar13 = 0;
      iVar23 = 0;
      while( true ) {
        if (this->numVertices <= lVar22) break;
        iVar2 = (this->vertexToCell).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start
                [(this->currentPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar22]];
        HVar11 = (HighsInt)lVar22;
        if (iVar23 != iVar2) {
          (this->currentPartitionLinks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar13] = HVar11;
          iVar13 = HVar11;
          iVar23 = iVar2;
        }
        updateCellMembership(this,HVar11,iVar13,false);
        lVar22 = lVar22 + 1;
      }
      (this->currentPartitionLinks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[iVar13] = this->numVertices;
      piVar8 = (this->currentPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar9 = piVar8;
      uVar20 = (long)(this->currentPartition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)piVar8 >> 2;
      while (piVar12 = piVar9, 0 < (long)uVar20) {
        uVar15 = uVar20 >> 1;
        uVar20 = ~uVar15 + uVar20;
        piVar9 = piVar12 + uVar15 + 1;
        if (this->numCol <= piVar12[uVar15]) {
          piVar9 = piVar12;
          uVar20 = uVar15;
        }
      }
      HVar11 = (HighsInt)((ulong)((long)piVar12 - (long)piVar8) >> 2);
    }
  }
  else {
    HVar11 = this->numCol;
  }
  this->numActiveCols = HVar11;
  return;
LAB_002f4402:
  piVar5[lVar22] = (int)((ulong)((long)ppVar19 - (long)ppVar3) >> 3);
  lVar22 = lVar22 + 1;
  goto LAB_002f4376;
}

Assistant:

void HighsSymmetryDetection::removeFixPoints() {
  Gend.resize(numVertices);
  for (HighsInt i = 0; i < numVertices; ++i) {
    Gend[i] =
        std::partition(Gedge.begin() + Gstart[i], Gedge.begin() + Gstart[i + 1],
                       [&](const std::pair<HighsInt, HighsUInt>& edge) {
                         return cellSize(vertexToCell[edge.first]) > 1;
                       }) -
        Gedge.begin();
    assert(Gend[i] >= Gstart[i] && Gend[i] <= Gstart[i + 1]);
  }

  HighsInt unitCellIndex = numVertices;
  currentPartition.erase(
      std::remove_if(currentPartition.begin(), currentPartition.end(),
                     [&](HighsInt vertex) {
                       if (cellSize(vertexToCell[vertex]) == 1) {
                         --unitCellIndex;
                         vertexToCell[vertex] = unitCellIndex;
                         return true;
                       }
                       return false;
                     }),
      currentPartition.end());

  for (HighsInt i = 0; i < numVertices; ++i) {
    if (Gend[i] == Gstart[i + 1]) continue;

    for (HighsInt j = Gend[i]; j < Gstart[i + 1]; ++j)
      Gedge[j].first = vertexToCell[Gedge[j].first];
  }

  if ((HighsInt)currentPartition.size() < numVertices) {
    numVertices = currentPartition.size();
    if (numVertices == 0) {
      numActiveCols = 0;
      return;
    }
    currentPartitionLinks.resize(numVertices);
    cellInRefinementQueue.assign(numVertices, false);
    assert(refinementQueue.empty());
    refinementQueue.clear();
    HighsInt cellStart = 0;
    HighsInt cellNumber = 0;
    for (HighsInt i = 0; i < numVertices; ++i) {
      HighsInt vertex = currentPartition[i];
      // if the cell number is different to the current cell number this is the
      // start of a new cell
      if (cellNumber != vertexToCell[vertex]) {
        // remember the number of this cell to identify its end
        cellNumber = vertexToCell[vertex];
        // set the link of the cell start to point to its end
        currentPartitionLinks[cellStart] = i;
        // remember start of this cell
        cellStart = i;
      }

      // correct the vertexToCell array to store the start index of the
      // cell, not its number
      updateCellMembership(i, cellStart, false);
    }

    // set the column partition link of the last started cell to point past the
    // end
    assert((int)currentPartitionLinks.size() > 0);
    currentPartitionLinks[cellStart] = numVertices;

    numActiveCols =
        std::partition_point(currentPartition.begin(), currentPartition.end(),
                             [&](HighsInt v) { return v < numCol; }) -
        currentPartition.begin();
  } else
    numActiveCols = numCol;
}